

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raise.c
# Opt level: O0

int raise(int __sig)

{
  __sighandler_t p_Var1;
  char *local_20;
  char *message;
  _func_void_int *sighandler;
  int sig_local;
  
  switch(__sig) {
  case 2:
    message = (char *)_PDCLIB_sigint;
    local_20 = "Interactive attention signal (SIGINT)";
    break;
  default:
    fprintf((FILE *)stderr,"Unknown signal #%d\n",(ulong)(uint)__sig);
    _Exit(-1);
  case 4:
    message = (char *)_PDCLIB_sigill;
    local_20 = "Illegal instruction (SIGILL)";
    break;
  case 6:
    message = (char *)_PDCLIB_sigabrt;
    local_20 = "Abnormal termination (SIGABRT)";
    break;
  case 8:
    message = (char *)_PDCLIB_sigfpe;
    local_20 = "Arithmetic exception (SIGFPE)";
    break;
  case 0xb:
    message = (char *)_PDCLIB_sigsegv;
    local_20 = "Invalid memory access (SIGSEGV)";
    break;
  case 0xf:
    message = (char *)_PDCLIB_sigterm;
    local_20 = "Termination request (SIGTERM)";
  }
  if (message == (char *)0x0) {
    fputs(local_20,(FILE *)stderr);
    _Exit(-1);
  }
  if (message != (char *)0x1) {
    p_Var1 = signal(__sig,(__sighandler_t)0x0);
    (*p_Var1)(__sig);
  }
  return 0;
}

Assistant:

int raise( int sig )
{
    void ( *sighandler )( int );
    const char * message;

    switch ( sig )
    {
        case SIGABRT:
            sighandler = _PDCLIB_sigabrt;
            message = "Abnormal termination (SIGABRT)";
            break;

        case SIGFPE:
            sighandler = _PDCLIB_sigfpe;
            message = "Arithmetic exception (SIGFPE)";
            break;

        case SIGILL:
            sighandler = _PDCLIB_sigill;
            message = "Illegal instruction (SIGILL)";
            break;

        case SIGINT:
            sighandler = _PDCLIB_sigint;
            message = "Interactive attention signal (SIGINT)";
            break;

        case SIGSEGV:
            sighandler = _PDCLIB_sigsegv;
            message = "Invalid memory access (SIGSEGV)";
            break;

        case SIGTERM:
            sighandler = _PDCLIB_sigterm;
            message = "Termination request (SIGTERM)";
            break;

        default:
            fprintf( stderr, "Unknown signal #%d\n", sig );
            _Exit( EXIT_FAILURE );
    }

    if ( sighandler == SIG_DFL )
    {
        fputs( message, stderr );
        _Exit( EXIT_FAILURE );
    }
    else if ( sighandler != SIG_IGN )
    {
        /* FIXME: "The implementation shall behave as if no library function
           calls the signal function."
        */
        sighandler = signal( sig, SIG_DFL );
        sighandler( sig );
    }

    return 0;
}